

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5bf3::TestCheckArray2DCloseFailureContainsCorrectDetails::RunImpl
          (TestCheckArray2DCloseFailureContainsCorrectDetails *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  int line;
  TestDetails testDetails;
  float local_8ac;
  ScopedCurrentTest scopedResults;
  int data2 [2] [2];
  int data1 [2] [2];
  TestDetails local_878;
  TestResults testResults;
  RecordingReporter reporter;
  
  line = 0;
  reporter.super_TestReporter._vptr_TestReporter = (_func_int **)&PTR__TestReporter_00150820;
  reporter.testRunCount = 0;
  reporter.testFailedCount = 0;
  reporter.lastFailedLine = 0;
  reporter.testFinishedCount = 0;
  reporter.lastStartedSuite[0] = '\0';
  reporter.lastStartedTest[0] = '\0';
  reporter.lastFailedFile[0] = '\0';
  reporter.lastFailedSuite[0] = '\0';
  reporter.lastFailedTest[0] = '\0';
  reporter.lastFailedMessage[0] = '\0';
  reporter.lastFinishedSuite[0] = '\0';
  reporter.lastFinishedTest[0] = '\0';
  reporter.lastFinishedTestTime = 0.0;
  reporter.summaryTotalTestCount = 0;
  reporter.summaryFailedTestCount = 0;
  reporter.summaryFailureCount = 0;
  reporter.summarySecondsElapsed = 0.0;
  UnitTest::TestResults::TestResults(&testResults,&reporter.super_TestReporter);
  UnitTest::TestDetails::TestDetails
            (&testDetails,"array2DCloseTest","array2DCloseSuite","filename",-1);
  ScopedCurrentTest::ScopedCurrentTest(&scopedResults,&testResults,&testDetails);
  data1[0][0] = 0;
  data1[0][1] = 1;
  data1[1][0] = 2;
  data1[1][1] = 3;
  data2[0][0] = 0;
  data2[0][1] = 1;
  data2[1][0] = 3;
  data2[1][1] = 3;
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_8ac = 0.01;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_878,*ppTVar3,0x2b1);
  UnitTest::CheckArray2DClose<int[2][2],int[2][2],float>
            (pTVar1,&data1,&data2,2,2,&local_8ac,&local_878);
  line = 0x2b1;
  ScopedCurrentTest::~ScopedCurrentTest(&scopedResults);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&testDetails,*ppTVar3,0x2b4);
  UnitTest::CheckEqual(pTVar1,"array2DCloseTest",reporter.lastFailedTest,&testDetails);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&testDetails,*ppTVar3,0x2b5);
  UnitTest::CheckEqual(pTVar1,"array2DCloseSuite",reporter.lastFailedSuite,&testDetails);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&testDetails,*ppTVar3,0x2b6);
  UnitTest::CheckEqual(pTVar1,"filename",reporter.lastFailedFile,&testDetails);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&testDetails,*ppTVar3,0x2b7);
  UnitTest::CheckEqual<int,int>(pTVar1,&line,&reporter.lastFailedLine,&testDetails);
  UnitTest::TestReporter::~TestReporter(&reporter.super_TestReporter);
  return;
}

Assistant:

TEST(CheckArray2DCloseFailureContainsCorrectDetails)
{
    int line = 0;
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		UnitTest::TestDetails testDetails("array2DCloseTest", "array2DCloseSuite", "filename", -1);
		ScopedCurrentTest scopedResults(testResults, &testDetails);

		int const data1[2][2] = { {0, 1}, {2, 3} };
        int const data2[2][2] = { {0, 1}, {3, 3} };
		CHECK_ARRAY2D_CLOSE (data1, data2, 2, 2, 0.01f);     line = __LINE__;
    }

    CHECK_EQUAL("array2DCloseTest", reporter.lastFailedTest);
    CHECK_EQUAL("array2DCloseSuite", reporter.lastFailedSuite);
    CHECK_EQUAL("filename", reporter.lastFailedFile);
    CHECK_EQUAL(line, reporter.lastFailedLine);
}